

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkExprList(Walker *pWalker,ExprList *p)

{
  int iVar1;
  ExprList_item *local_30;
  ExprList_item *pItem;
  int i;
  ExprList *p_local;
  Walker *pWalker_local;
  
  if (p != (ExprList *)0x0) {
    local_30 = p->a;
    for (pItem._4_4_ = p->nExpr; 0 < pItem._4_4_; pItem._4_4_ = pItem._4_4_ + -1) {
      iVar1 = sqlite3WalkExpr(pWalker,local_30->pExpr);
      if (iVar1 != 0) {
        return 2;
      }
      local_30 = local_30 + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkExprList(Walker *pWalker, ExprList *p){
  int i;
  struct ExprList_item *pItem;
  if( p ){
    for(i=p->nExpr, pItem=p->a; i>0; i--, pItem++){
      if( sqlite3WalkExpr(pWalker, pItem->pExpr) ) return WRC_Abort;
    }
  }
  return WRC_Continue;
}